

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profile.cpp
# Opt level: O1

void __thiscall Profile::__displayBacktraceStaticMap(Profile *this)

{
  DynFuncCall *dfc;
  _Base_ptr this_00;
  bool bVar1;
  long *plVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  _Self __tmp;
  string key;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (DebugFlag) {
    bVar1 = isCurrentDebugType("info");
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"__displayBacktraceStaticMap",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      plVar2 = (long *)std::ostream::operator<<(&std::cerr,0x10c);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
    }
  }
  p_Var4 = (this->__backtraceStaticMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->__backtraceStaticMap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,*(long *)(p_Var4 + 1),
                 (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
      dfc = *(DynFuncCall **)(p_Var4 + 2);
      this_00 = p_Var4[2]._M_parent;
      if (this_00 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        }
      }
      poVar3 = operator<<((ostream *)&std::cerr,dfc);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (DebugFlag == true) {
        bVar1 = isCurrentDebugType("info");
        if (bVar1) {
          poVar3 = operator<<((ostream *)&std::cerr,dfc);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
        }
      }
      if (this_00 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  return;
}

Assistant:

void Profile::__displayBacktraceStaticMap(){
    DEBUG("info",cerr << __FUNCTION__ << ":" << __LINE__<< endl;);
    for (auto it = __backtraceStaticMap.begin(); it != __backtraceStaticMap.end(); it++){
        string key = it->first;
        shared_ptr<DynFuncCall>value = it->second;
        cerr << *value << endl;
        DEBUG("info",cerr << *value << endl;);
    }
}